

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_function_object.cpp
# Opt level: O0

void test_main(void)

{
  version vVar1;
  char *pcVar2;
  string local_b00;
  allocator<char> local_ad9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ad8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ab8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a38;
  string_view local_a18;
  basic_string_view<char,_std::char_traits<char>_> local_a08;
  string local_9f8;
  allocator<char> local_9d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_990;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_970;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_950;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_930;
  string_view local_910;
  basic_string_view<char,_std::char_traits<char>_> local_900;
  string local_8f0;
  allocator<char> local_8c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_888;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_868;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_848;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_828;
  string_view local_808;
  basic_string_view<char,_std::char_traits<char>_> local_7f8;
  basic_string_view<char,_std::char_traits<char>_> local_7e8;
  string local_7d8;
  value local_7c8;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_7a0;
  basic_string_view<char,_std::char_traits<char>_> local_790;
  string local_780;
  value local_770;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_748;
  wchar_t *local_738;
  wchar_t *apply_normal_object;
  allocator<char> local_709;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_708;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_688;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_668;
  string_view local_648;
  basic_string_view<char,_std::char_traits<char>_> local_638;
  string local_628;
  allocator<char> local_601;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_600;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_580;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_560;
  string_view local_540;
  basic_string_view<char,_std::char_traits<char>_> local_530;
  string local_520;
  allocator<char> local_4f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  string_view local_438;
  basic_string_view<char,_std::char_traits<char>_> local_428;
  value local_418;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_3f0;
  value local_3e0;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_3b8;
  undefined4 local_3a4;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_3a0;
  value local_390;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_368;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_358;
  basic_string_view<char,_std::char_traits<char>_> local_348;
  string local_338;
  value local_328;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_300;
  string local_2f0;
  allocator<char> local_2c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  string_view local_208;
  basic_string_view<char,_std::char_traits<char>_> local_1f8;
  string local_1e8;
  allocator<char> local_1c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  string_view local_100;
  basic_string_view<char,_std::char_traits<char>_> local_f0;
  value local_e0;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_b8 [2];
  basic_string_view<char,_std::char_traits<char>_> local_98;
  undefined1 local_88 [8];
  string expected_keys;
  gc_heap h;
  
  mjs::gc_heap::gc_heap
            ((gc_heap *)
             &expected_keys.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_,0x100);
  vVar1 = tested_version();
  pcVar2 = "prototype,";
  if (vVar1 != es3) {
    pcVar2 = "";
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_98,pcVar2);
  mjs::string::string((string *)local_88,
                      (gc_heap *)
                      &expected_keys.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.
                       pos_,&local_98);
  run_test_debug_pos("test_main",
                     "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_function_object.cpp"
                     ,10);
  std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
            (local_b8,L"s=\'\'; function a(){}; for(k in a) { s+=k+\',\'; }; s");
  mjs::value::value(&local_e0,(string *)local_88);
  run_test(local_b8,&local_e0);
  mjs::value::~value(&local_e0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_f0,
             "\nfunction a(x,y,z){};\ndelete a.length; //$boolean false\na.length;//$number 3\ndelete a.prototype.constructor; //$boolean true\nFunction.prototype(1,2,3); //$undefined\nFunction.toString(); //$string \'function Function() { [native code] }\'\nFunction.prototype.toString(); //$string \'function () { [native code] }\'\n\nfunction f() { return this; }\nf() == global; //$boolean true\nf(undefined) == global; //$boolean true\nf(null) == global; //$boolean true\nNumber.prototype.toString = f;\nn=(42).toString();\ntypeof n; //$string \'object\'\nn.valueOf(); //$number 42\n"
            );
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,"testspec@",&local_1c1);
  std::operator+(&local_1a0,&local_1c0,
                 "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_function_object.cpp"
                );
  std::operator+(&local_180,&local_1a0,"@");
  std::operator+(&local_160,&local_180,"test_main");
  std::operator+(&local_140,&local_160,"@");
  std::__cxx11::to_string(&local_1e8,0x1d);
  std::operator+(&local_120,&local_140,&local_1e8);
  local_100 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_120);
  mjs::run_test_spec(&local_f0,&local_100);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator(&local_1c1);
  vVar1 = tested_version();
  if ((int)vVar1 < 1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_1f8,
               "\nfunction a(x,y,z){};\ndelete a.arguments; //$boolean false\na.arguments; //$null\n"
              );
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c8,"testspec@",&local_2c9);
    std::operator+(&local_2a8,&local_2c8,
                   "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_function_object.cpp"
                  );
    std::operator+(&local_288,&local_2a8,"@");
    std::operator+(&local_268,&local_288,"test_main");
    std::operator+(&local_248,&local_268,"@");
    std::__cxx11::to_string(&local_2f0,0x25);
    std::operator+(&local_228,&local_248,&local_2f0);
    local_208 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_228);
    mjs::run_test_spec(&local_1f8,&local_208);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_2f0);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_288);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::__cxx11::string::~string((string *)&local_2c8);
    std::allocator<char>::~allocator(&local_2c9);
  }
  run_test_debug_pos("test_main",
                     "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_function_object.cpp"
                     ,0x2a);
  std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
            (&local_300,L"function a(){}; s=\'\'; for(k in a)s+=k+\',\'; s");
  vVar1 = tested_version();
  pcVar2 = "prototype,";
  if (vVar1 != es3) {
    pcVar2 = "";
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_348,pcVar2);
  mjs::string::string(&local_338,
                      (gc_heap *)
                      &expected_keys.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.
                       pos_,&local_348);
  mjs::value::value(&local_328,&local_338);
  run_test(&local_300,&local_328);
  mjs::value::~value(&local_328);
  mjs::string::~string(&local_338);
  vVar1 = tested_version();
  if ((int)vVar1 < 2) {
    run_test_debug_pos("test_main",
                       "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_function_object.cpp"
                       ,0x2d);
    std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
              (&local_358,L"Function.prototype.bind");
    run_test(&local_358,(value *)mjs::value::undefined);
  }
  vVar1 = tested_version();
  if ((int)vVar1 < 1) {
    run_test_debug_pos("test_main",
                       "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_function_object.cpp"
                       ,0x32);
    std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
              (&local_368,L"function a(){}; (delete a.prototype)");
    mjs::value::value(&local_390,true);
    run_test(&local_368,&local_390);
    mjs::value::~value(&local_390);
    run_test_debug_pos("test_main",
                       "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_function_object.cpp"
                       ,0x34);
    std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
              (&local_3a0,L"fp = Function.prototype; fp[\'call\'] || fp[\'apply\']");
    run_test(&local_3a0,(value *)mjs::value::undefined);
    local_3a4 = 1;
  }
  else {
    run_test_debug_pos("test_main",
                       "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_function_object.cpp"
                       ,0x39);
    std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
              (&local_3b8,L"function a(){}; (delete a.prototype)");
    mjs::value::value(&local_3e0,false);
    run_test(&local_3b8,&local_3e0);
    mjs::value::~value(&local_3e0);
    run_test_debug_pos("test_main",
                       "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_function_object.cpp"
                       ,0x3c);
    std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
              (&local_3f0,L"function f(){ f=42; return f==42||delete f;}; f()");
    mjs::value::value(&local_418,false);
    run_test(&local_3f0,&local_418);
    mjs::value::~value(&local_418);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_428,
               "\nFunction.prototype.apply.length; //$number 2\nfunction f(a,b,c) { return \'\'+this[\'x\']+a+b+c; }\nx=42;\nf.apply(); //$string \'42undefinedundefinedundefined\'\nf.apply(null); //$string \'42undefinedundefinedundefined\'\nf.apply({}); //$string \'undefinedundefinedundefinedundefined\'\nf.apply({x:60},[\'a\',\'b\']); //$string \'60abundefined\'\nf.apply({x:\'z\'},[1,2,3,4]); //$string \'z123\'\n\nString.prototype.charAt.apply(\'test\',[2]); //$string \'s\'\n\nString.prototype.apply = Function.prototype.apply;\ntry { (\'h\').apply(); } catch (e) {\n    e.toString().toLowerCase(); //$ string \'typeerror: string is not a function\'\n}\n"
              );
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4f8,"testspec@",&local_4f9);
    std::operator+(&local_4d8,&local_4f8,
                   "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_function_object.cpp"
                  );
    std::operator+(&local_4b8,&local_4d8,"@");
    std::operator+(&local_498,&local_4b8,"test_main");
    std::operator+(&local_478,&local_498,"@");
    std::__cxx11::to_string(&local_520,0x4e);
    std::operator+(&local_458,&local_478,&local_520);
    local_438 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_458);
    mjs::run_test_spec(&local_428,&local_438);
    std::__cxx11::string::~string((string *)&local_458);
    std::__cxx11::string::~string((string *)&local_520);
    std::__cxx11::string::~string((string *)&local_478);
    std::__cxx11::string::~string((string *)&local_498);
    std::__cxx11::string::~string((string *)&local_4b8);
    std::__cxx11::string::~string((string *)&local_4d8);
    std::__cxx11::string::~string((string *)&local_4f8);
    std::allocator<char>::~allocator(&local_4f9);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_530,
               "\nFunction.prototype.call.length; //$number 1\nfunction f(a,b,c) { return \'\'+this[\'x\']+a+b+c; }\nx=42;\nf.call(); //$string \'42undefinedundefinedundefined\'\nf.call(null); //$string \'42undefinedundefinedundefined\'\nf.call({}); //$string \'undefinedundefinedundefinedundefined\'\nf.call({x:60},\'a\',\'b\'); //$string \'60abundefined\'\nf.call({x:\'z\'},1,2,3,4); //$string \'z123\'\n\nString.prototype.charAt.call(\'test\',2); //$string \'s\'\n\nString.prototype.call = Function.prototype.call;\ntry { (\'h\').call(); } catch (e) {\n    e.toString().toLowerCase(); //$ string \'typeerror: string is not a function\'\n}\n"
              );
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_600,"testspec@",&local_601);
    std::operator+(&local_5e0,&local_600,
                   "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_function_object.cpp"
                  );
    std::operator+(&local_5c0,&local_5e0,"@");
    std::operator+(&local_5a0,&local_5c0,"test_main");
    std::operator+(&local_580,&local_5a0,"@");
    std::__cxx11::to_string(&local_628,0x60);
    std::operator+(&local_560,&local_580,&local_628);
    local_540 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_560);
    mjs::run_test_spec(&local_530,&local_540);
    std::__cxx11::string::~string((string *)&local_560);
    std::__cxx11::string::~string((string *)&local_628);
    std::__cxx11::string::~string((string *)&local_580);
    std::__cxx11::string::~string((string *)&local_5a0);
    std::__cxx11::string::~string((string *)&local_5c0);
    std::__cxx11::string::~string((string *)&local_5e0);
    std::__cxx11::string::~string((string *)&local_600);
    std::allocator<char>::~allocator(&local_601);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_638,
               "\n// ES3, 15.3.2.1\ntry {new Function(\'a;b\',\'return a+b\');} catch (e) { e.toString(); } //$string \'SyntaxError: Invalid argument to function constructor\'\ntry {new Function(\'a,b\',\'*a\');} catch (e) { e.toString(); } //$string \'SyntaxError: Invalid argument to function constructor\'\n\n// ES3, 11.2.2, 11.2.3\ntry {new 42;} catch (e) { e.toString(); } //$string \'TypeError: 42 is not an object\'\ntry {({})();} catch (e) { e.toString(); } //$string \'TypeError: Object is not a function\'\ntry {42();} catch (e) { e.toString(); } //$string \'TypeError: 42 is not a function\'\n\n// ES3, 15.3.4.2\ntry { Function.prototype.toString.call(42); } catch (e) { e.toString().toLowerCase(); } //$string \'typeerror: number is not a function\'\n\n// ES3, 15.3.4.3\no = {}\no.apply = Function.prototype.apply;\ntry { o.apply(); } catch (e) { e.toString(); } //$string \'TypeError: Object is not a function\'\n\nfunction g(a,b) { return \'(\'+a+\';\'+b+\')\'; }\nfunction f() { return g.apply(null, arguments); }\nf(1,2); //$string \'(1;2)\'\ng.apply(null, [3,4]); //$string \'(3;4)\'\n\n// ES3, 15.3.4.4\no = {}\no.call = Function.prototype.call;\ntry { o.call(); } catch (e) { e.toString(); } //$string \'TypeError: Object is not a function\'\n\n// ES3, 15.3.5.3\nfunction f() {}\nfi = new f();\nfi instanceof f; //$boolean true\nf.prototype = undefined;\ntry { fi instanceof f; } catch (e) { e.toString(); } //$string \'TypeError: Function has non-object prototype of type undefined in instanceof check\'\n"
              );
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_708,"testspec@",&local_709);
    std::operator+(&local_6e8,&local_708,
                   "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_function_object.cpp"
                  );
    std::operator+(&local_6c8,&local_6e8,"@");
    std::operator+(&local_6a8,&local_6c8,"test_main");
    std::operator+(&local_688,&local_6a8,"@");
    std::__cxx11::to_string((string *)&apply_normal_object,0x84);
    std::operator+(&local_668,&local_688,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &apply_normal_object);
    local_648 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_668);
    mjs::run_test_spec(&local_638,&local_648);
    std::__cxx11::string::~string((string *)&local_668);
    std::__cxx11::string::~string((string *)&apply_normal_object);
    std::__cxx11::string::~string((string *)&local_688);
    std::__cxx11::string::~string((string *)&local_6a8);
    std::__cxx11::string::~string((string *)&local_6c8);
    std::__cxx11::string::~string((string *)&local_6e8);
    std::__cxx11::string::~string((string *)&local_708);
    std::allocator<char>::~allocator(&local_709);
    local_738 = 
    L"try { Number.prototype.toString.apply(42, {\'length\':1,0:16}); } catch (e) { e.toString(); }"
    ;
    vVar1 = tested_version();
    if ((int)vVar1 < 2) {
      run_test_debug_pos("test_main",
                         "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_function_object.cpp"
                         ,0x89);
      std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
                (&local_748,
                 L"try { Number.prototype.toString.apply(42, {\'length\':1,0:16}); } catch (e) { e.toString(); }"
                );
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_790,"TypeError: Object is not an (arguments) array");
      mjs::string::string(&local_780,
                          (gc_heap *)
                          &expected_keys.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped
                           .pos_,&local_790);
      mjs::value::value(&local_770,&local_780);
      run_test(&local_748,&local_770);
      mjs::value::~value(&local_770);
      mjs::string::~string(&local_780);
    }
    else {
      run_test_debug_pos("test_main",
                         "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_function_object.cpp"
                         ,0x8c);
      std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
                (&local_7a0,
                 L"try { Number.prototype.toString.apply(42, {\'length\':1,0:16}); } catch (e) { e.toString(); }"
                );
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_7e8,"2a");
      mjs::string::string(&local_7d8,
                          (gc_heap *)
                          &expected_keys.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped
                           .pos_,&local_7e8);
      mjs::value::value(&local_7c8,&local_7d8);
      run_test(&local_7a0,&local_7c8);
      mjs::value::~value(&local_7c8);
      mjs::string::~string(&local_7d8);
    }
    vVar1 = tested_version();
    if (1 < (int)vVar1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_7f8,
                 "\nFunction.prototype.bind.length;//$number 1\ntry { Function.prototype.bind.call(new String(\'\'),42); } catch (e) { e.toString(); } //$string \'TypeError: String is not a function\'\nfunction f(){};\nf.prototype = Function.prototype;\nvar fi = new f();\ntry { fi.bind(); } catch (e) { e.toString(); } //$string \'TypeError: f is not a function\'\n\nr = (function(){return this}).bind()(); r === global; //$boolean true\nr = (function(){return this}).bind()(undefined); r === global; //$boolean true\nr = (function(){return this}).bind()(null); r === global; //$boolean true\na=(function(){return this}).bind(42);\na.length;//$number 0\nr=a(); r instanceof Number; //$boolean true\nr.valueOf(); //$ number 42\nadd1=(function(x,y){return x+y;}).bind(undefined,1);\nadd1(42);//$number 43\nadd1(\'x \');//$string \'1x \'\nadd1.length;//$number 1\nadd12=add1.bind(2,3);\nadd12(4); //$number 4\nadd12.length;//$number 0\nadd12x=add12.bind(4,5);\nadd12x(4); //$number 4\nadd12x.length;//$number 0\n\nadd2=(function(x,y){return x+y;}).bind(undefined,1,2,3);\nadd2(42); //$number 3\nadd2.length; //$number 0\n\nfunction fmt(v) { return v+\':\'+typeof v; }\nfunction fmtall(o) { var r = \'{\'; var p = Object.getOwnPropertyNames(o);for(var i=0;i<p.length;++i) { r+=\' \'+p[i]+\'=\'+fmt(o[p[i]]); }; return r+\'}\'; }\nfunction f(a,b) { s+=\'this=\'+fmtall(this)+\',arguments=\'+fmtall(arguments); this.x=a; this.y=b; };\ns = \'\'; x = f.bind(new String(\'x\'),new String(\'y\'));\ns; //$string \'\'\nr=new x(42,43,44);\ns; //$string \'this={},arguments={ length=4:number 0=y:object 1=42:number 2=43:number 3=44:number callee=function f(a,b) { s+=\\\'this=\\\'+fmtall(this)+\\\',arguments=\\\'+fmtall(arguments); this.x=a; this.y=b; }:function}\'\nr instanceof f; //$boolean true\nfmtall(r); //$string \'{ x=y:object y=42:number}\'\n"
                );
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_8c8,"testspec@",&local_8c9);
      std::operator+(&local_8a8,&local_8c8,
                     "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_function_object.cpp"
                    );
      std::operator+(&local_888,&local_8a8,"@");
      std::operator+(&local_868,&local_888,"test_main");
      std::operator+(&local_848,&local_868,"@");
      std::__cxx11::to_string(&local_8f0,0xb9);
      std::operator+(&local_828,&local_848,&local_8f0);
      local_808 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_828);
      mjs::run_test_spec(&local_7f8,&local_808);
      std::__cxx11::string::~string((string *)&local_828);
      std::__cxx11::string::~string((string *)&local_8f0);
      std::__cxx11::string::~string((string *)&local_848);
      std::__cxx11::string::~string((string *)&local_868);
      std::__cxx11::string::~string((string *)&local_888);
      std::__cxx11::string::~string((string *)&local_8a8);
      std::__cxx11::string::~string((string *)&local_8c8);
      std::allocator<char>::~allocator(&local_8c9);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_900,
                 "\ntry { (function(){\'use strict\'; return arguments.callee;})() } catch (e) { e.toString(); } //$string \'TypeError: Property may not be accessed in strict mode\'\ntry { (function(){\'use strict\'; arguments.callee = 42;})()   } catch (e) { e.toString(); } //$string \'TypeError: Property may not be accessed in strict mode\'\ntry { (function(){\'use strict\'; return arguments.caller;})() } catch (e) { e.toString(); } //$string \'TypeError: Property may not be accessed in strict mode\'\ntry { (function(){\'use strict\'; arguments.caller = 42;})()   } catch (e) { e.toString(); } //$string \'TypeError: Property may not be accessed in strict mode\'\n\nfunction f(){};\n(function(){\'use strict\'; f.callee=42; return f.callee; })(); //$number 42\n(function(){\'use strict\'; f.caller=55; return f.caller; })(); //$number 55\n\n(function(){\n    \'use strict\';\n    function g(){};\n    try { g.arguments;      } catch (e) { e.toString(); } //$string \'TypeError: Property may not be accessed in strict mode\'\n    try { g.arguments = 42; } catch (e) { e.toString(); } //$string \'TypeError: Property may not be accessed in strict mode\'\n    try { g.caller;         } catch (e) { e.toString(); } //$string \'TypeError: Property may not be accessed in strict mode\'\n    try { g.caller = 42;    } catch (e) { e.toString(); } //$string \'TypeError: Property may not be accessed in strict mode\'\n})();\n\n"
                );
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_9d0,"testspec@",&local_9d1);
      std::operator+(&local_9b0,&local_9d0,
                     "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_function_object.cpp"
                    );
      std::operator+(&local_990,&local_9b0,"@");
      std::operator+(&local_970,&local_990,"test_main");
      std::operator+(&local_950,&local_970,"@");
      std::__cxx11::to_string(&local_9f8,0xce);
      std::operator+(&local_930,&local_950,&local_9f8);
      local_910 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_930);
      mjs::run_test_spec(&local_900,&local_910);
      std::__cxx11::string::~string((string *)&local_930);
      std::__cxx11::string::~string((string *)&local_9f8);
      std::__cxx11::string::~string((string *)&local_950);
      std::__cxx11::string::~string((string *)&local_970);
      std::__cxx11::string::~string((string *)&local_990);
      std::__cxx11::string::~string((string *)&local_9b0);
      std::__cxx11::string::~string((string *)&local_9d0);
      std::allocator<char>::~allocator(&local_9d1);
    }
    vVar1 = tested_version();
    if (1 < (int)vVar1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_a08,
                 "\n(function() {\n    \'use strict\';\n    var q;\n    Object.defineProperty(Number.prototype, \'foo\', {\n        configurable: true,\n        get: function() { return this; },\n        set: function() { q=this; },\n    });\n    var x = 60;\n    x.foo; //$number 60\n    q;//$undefined\n    x.foo *= 2;\n    q;//$number 60\n})();\n\n(function() {\n    \'use strict\';\n    var q;\n    Object.defineProperty(Boolean.prototype, \'foo\', {\n        configurable: true,\n        get: function() { return this; },\n        set: function() { q=this; },\n    });\n    var x = true;\n    x.foo; //$boolean true\n    q;//$undefined\n    x.foo *= 2;\n    q;//$boolean true\n})();\n\n(function() {\n    \'use strict\';\n    var q;\n    Object.defineProperty(String.prototype, \'foo\', {\n        configurable: true,\n        get: function() { return this; },\n        set: function() { q=this; },\n    });\n    var x = \'test\';\n    x.foo; //$string \'test\'\n    q;//$undefined\n    x.foo *= 2;\n    q;//$string \'test\'\n})();\n\nfunction f() { \"use strict\"; return this; }\nf(); //$undefined\nf(undefined); //$undefined\nNumber.prototype.toString = f;\nn=(42+1).toString();\ntypeof n; //$string \'number\'\nn === 43; //$boolean true\nn.valueOf(); //$number 43\n\nf.apply(); //$undefined\nf.apply(undefined); //$undefined\n// maybe undefined???\nf.apply(null); //$null\nf.apply(false); //$boolean false\nf.apply(60); //$number 60\nf.apply(\'x\'); //$string \'x\'\n\nf.call(); //$undefined\nf.call(undefined); //$undefined\nf.call(null); //$null\nf.call(false); //$boolean false\nf.call(60); //$number 60\nf.call(\'x\'); //$string \'x\'\n"
                );
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_ad8,"testspec@",&local_ad9);
      std::operator+(&local_ab8,&local_ad8,
                     "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_function_object.cpp"
                    );
      std::operator+(&local_a98,&local_ab8,"@");
      std::operator+(&local_a78,&local_a98,"test_main");
      std::operator+(&local_a58,&local_a78,"@");
      std::__cxx11::to_string(&local_b00,0x11a);
      std::operator+(&local_a38,&local_a58,&local_b00);
      local_a18 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_a38);
      mjs::run_test_spec(&local_a08,&local_a18);
      std::__cxx11::string::~string((string *)&local_a38);
      std::__cxx11::string::~string((string *)&local_b00);
      std::__cxx11::string::~string((string *)&local_a58);
      std::__cxx11::string::~string((string *)&local_a78);
      std::__cxx11::string::~string((string *)&local_a98);
      std::__cxx11::string::~string((string *)&local_ab8);
      std::__cxx11::string::~string((string *)&local_ad8);
      std::allocator<char>::~allocator(&local_ad9);
    }
    local_3a4 = 0;
  }
  mjs::string::~string((string *)local_88);
  mjs::gc_heap::~gc_heap
            ((gc_heap *)
             &expected_keys.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_);
  return;
}

Assistant:

void test_main() {
    gc_heap h{256};
    // In ES3 prototype only has attributes DontDelete, in ES1 it's DontEnum
    const string expected_keys{h, tested_version() != version::es3 ? "" : "prototype,"};
    RUN_TEST(L"s=''; function a(){}; for(k in a) { s+=k+','; }; s", value{expected_keys});
    // length and are arguments should be DontDelete|DontEnum|ReadOnly
    RUN_TEST_SPEC(R"(
function a(x,y,z){};
delete a.length; //$boolean false
a.length;//$number 3
delete a.prototype.constructor; //$boolean true
Function.prototype(1,2,3); //$undefined
Function.toString(); //$string 'function Function() { [native code] }'
Function.prototype.toString(); //$string 'function () { [native code] }'

function f() { return this; }
f() == global; //$boolean true
f(undefined) == global; //$boolean true
f(null) == global; //$boolean true
Number.prototype.toString = f;
n=(42).toString();
typeof n; //$string 'object'
n.valueOf(); //$number 42
)");

    // No "arguments" in ES3+
    if (tested_version() < version::es3) {
        RUN_TEST_SPEC(R"(
function a(x,y,z){};
delete a.arguments; //$boolean false
a.arguments; //$null
)");
    }


    // ES5.1, 15.3.5.2 "In Edition 5, the prototype property of Function instances is not enumerable. In Edition 3, this property was enumerable"
    RUN_TEST(L"function a(){}; s=''; for(k in a)s+=k+','; s", value{string{h, tested_version() != version::es3 ? "" : "prototype,"}});

    if (tested_version() < version::es5) {
        RUN_TEST(L"Function.prototype.bind", value::undefined);
    }

    if (tested_version() < version::es3) {
        // In ES1 prototype should be DontEnum only
        RUN_TEST(L"function a(){}; (delete a.prototype)", value{true});
        // Shouldn't have call/apply
        RUN_TEST(L"fp = Function.prototype; fp['call'] || fp['apply']", value::undefined);
        return;
    }

    // In ES3 prototype is DontDelete
    RUN_TEST(L"function a(){}; (delete a.prototype)", value{false});

    // The function identifier is DontDelete, ReadOnly
    RUN_TEST(L"function f(){ f=42; return f==42||delete f;}; f()", value{false});

    RUN_TEST_SPEC(R"(
Function.prototype.apply.length; //$number 2
function f(a,b,c) { return ''+this['x']+a+b+c; }
x=42;
f.apply(); //$string '42undefinedundefinedundefined'
f.apply(null); //$string '42undefinedundefinedundefined'
f.apply({}); //$string 'undefinedundefinedundefinedundefined'
f.apply({x:60},['a','b']); //$string '60abundefined'
f.apply({x:'z'},[1,2,3,4]); //$string 'z123'

String.prototype.charAt.apply('test',[2]); //$string 's'

String.prototype.apply = Function.prototype.apply;
try { ('h').apply(); } catch (e) {
    e.toString().toLowerCase(); //$ string 'typeerror: string is not a function'
}
)");

    RUN_TEST_SPEC(R"(
Function.prototype.call.length; //$number 1
function f(a,b,c) { return ''+this['x']+a+b+c; }
x=42;
f.call(); //$string '42undefinedundefinedundefined'
f.call(null); //$string '42undefinedundefinedundefined'
f.call({}); //$string 'undefinedundefinedundefinedundefined'
f.call({x:60},'a','b'); //$string '60abundefined'
f.call({x:'z'},1,2,3,4); //$string 'z123'

String.prototype.charAt.call('test',2); //$string 's'

String.prototype.call = Function.prototype.call;
try { ('h').call(); } catch (e) {
    e.toString().toLowerCase(); //$ string 'typeerror: string is not a function'
}
)");

    RUN_TEST_SPEC(R"(
// ES3, 15.3.2.1
try {new Function('a;b','return a+b');} catch (e) { e.toString(); } //$string 'SyntaxError: Invalid argument to function constructor'
try {new Function('a,b','*a');} catch (e) { e.toString(); } //$string 'SyntaxError: Invalid argument to function constructor'

// ES3, 11.2.2, 11.2.3
try {new 42;} catch (e) { e.toString(); } //$string 'TypeError: 42 is not an object'
try {({})();} catch (e) { e.toString(); } //$string 'TypeError: Object is not a function'
try {42();} catch (e) { e.toString(); } //$string 'TypeError: 42 is not a function'

// ES3, 15.3.4.2
try { Function.prototype.toString.call(42); } catch (e) { e.toString().toLowerCase(); } //$string 'typeerror: number is not a function'

// ES3, 15.3.4.3
o = {}
o.apply = Function.prototype.apply;
try { o.apply(); } catch (e) { e.toString(); } //$string 'TypeError: Object is not a function'

function g(a,b) { return '('+a+';'+b+')'; }
function f() { return g.apply(null, arguments); }
f(1,2); //$string '(1;2)'
g.apply(null, [3,4]); //$string '(3;4)'

// ES3, 15.3.4.4
o = {}
o.call = Function.prototype.call;
try { o.call(); } catch (e) { e.toString(); } //$string 'TypeError: Object is not a function'

// ES3, 15.3.5.3
function f() {}
fi = new f();
fi instanceof f; //$boolean true
f.prototype = undefined;
try { fi instanceof f; } catch (e) { e.toString(); } //$string 'TypeError: Function has non-object prototype of type undefined in instanceof check'
)");

    const wchar_t* const apply_normal_object = L"try { Number.prototype.toString.apply(42, {'length':1,0:16}); } catch (e) { e.toString(); }";
    if (tested_version() < version::es5) {
        // In ES3 the second argument to Function.prototype.apply must be an Arguments object or an Array.
        RUN_TEST(apply_normal_object, value{string{h, "TypeError: Object is not an (arguments) array"}});
    } else {
        // ES5.1, 15.3.4.3 the second argument to apply can be any object with a length property
        RUN_TEST(apply_normal_object, value{string{h, "2a"}});
    }

    // Function.prototype.bind
    if (tested_version() >= version::es5) {

        RUN_TEST_SPEC(R"(
Function.prototype.bind.length;//$number 1
try { Function.prototype.bind.call(new String(''),42); } catch (e) { e.toString(); } //$string 'TypeError: String is not a function'
function f(){};
f.prototype = Function.prototype;
var fi = new f();
try { fi.bind(); } catch (e) { e.toString(); } //$string 'TypeError: f is not a function'

r = (function(){return this}).bind()(); r === global; //$boolean true
r = (function(){return this}).bind()(undefined); r === global; //$boolean true
r = (function(){return this}).bind()(null); r === global; //$boolean true
a=(function(){return this}).bind(42);
a.length;//$number 0
r=a(); r instanceof Number; //$boolean true
r.valueOf(); //$ number 42
add1=(function(x,y){return x+y;}).bind(undefined,1);
add1(42);//$number 43
add1('x ');//$string '1x '
add1.length;//$number 1
add12=add1.bind(2,3);
add12(4); //$number 4
add12.length;//$number 0
add12x=add12.bind(4,5);
add12x(4); //$number 4
add12x.length;//$number 0

add2=(function(x,y){return x+y;}).bind(undefined,1,2,3);
add2(42); //$number 3
add2.length; //$number 0

function fmt(v) { return v+':'+typeof v; }
function fmtall(o) { var r = '{'; var p = Object.getOwnPropertyNames(o);for(var i=0;i<p.length;++i) { r+=' '+p[i]+'='+fmt(o[p[i]]); }; return r+'}'; }
function f(a,b) { s+='this='+fmtall(this)+',arguments='+fmtall(arguments); this.x=a; this.y=b; };
s = ''; x = f.bind(new String('x'),new String('y'));
s; //$string ''
r=new x(42,43,44);
s; //$string 'this={},arguments={ length=4:number 0=y:object 1=42:number 2=43:number 3=44:number callee=function f(a,b) { s+=\'this=\'+fmtall(this)+\',arguments=\'+fmtall(arguments); this.x=a; this.y=b; }:function}'
r instanceof f; //$boolean true
fmtall(r); //$string '{ x=y:object y=42:number}'
)");

        RUN_TEST_SPEC(R"(
try { (function(){'use strict'; return arguments.callee;})() } catch (e) { e.toString(); } //$string 'TypeError: Property may not be accessed in strict mode'
try { (function(){'use strict'; arguments.callee = 42;})()   } catch (e) { e.toString(); } //$string 'TypeError: Property may not be accessed in strict mode'
try { (function(){'use strict'; return arguments.caller;})() } catch (e) { e.toString(); } //$string 'TypeError: Property may not be accessed in strict mode'
try { (function(){'use strict'; arguments.caller = 42;})()   } catch (e) { e.toString(); } //$string 'TypeError: Property may not be accessed in strict mode'

function f(){};
(function(){'use strict'; f.callee=42; return f.callee; })(); //$number 42
(function(){'use strict'; f.caller=55; return f.caller; })(); //$number 55

(function(){
    'use strict';
    function g(){};
    try { g.arguments;      } catch (e) { e.toString(); } //$string 'TypeError: Property may not be accessed in strict mode'
    try { g.arguments = 42; } catch (e) { e.toString(); } //$string 'TypeError: Property may not be accessed in strict mode'
    try { g.caller;         } catch (e) { e.toString(); } //$string 'TypeError: Property may not be accessed in strict mode'
    try { g.caller = 42;    } catch (e) { e.toString(); } //$string 'TypeError: Property may not be accessed in strict mode'
})();

)");
    }

    //
    // Check the value of 'this' in strict-mode functions 
    //
    if (tested_version() >= version::es5) {
        RUN_TEST_SPEC(R"(
(function() {
    'use strict';
    var q;
    Object.defineProperty(Number.prototype, 'foo', {
        configurable: true,
        get: function() { return this; },
        set: function() { q=this; },
    });
    var x = 60;
    x.foo; //$number 60
    q;//$undefined
    x.foo *= 2;
    q;//$number 60
})();

(function() {
    'use strict';
    var q;
    Object.defineProperty(Boolean.prototype, 'foo', {
        configurable: true,
        get: function() { return this; },
        set: function() { q=this; },
    });
    var x = true;
    x.foo; //$boolean true
    q;//$undefined
    x.foo *= 2;
    q;//$boolean true
})();

(function() {
    'use strict';
    var q;
    Object.defineProperty(String.prototype, 'foo', {
        configurable: true,
        get: function() { return this; },
        set: function() { q=this; },
    });
    var x = 'test';
    x.foo; //$string 'test'
    q;//$undefined
    x.foo *= 2;
    q;//$string 'test'
})();

function f() { "use strict"; return this; }
f(); //$undefined
f(undefined); //$undefined
Number.prototype.toString = f;
n=(42+1).toString();
typeof n; //$string 'number'
n === 43; //$boolean true
n.valueOf(); //$number 43

f.apply(); //$undefined
f.apply(undefined); //$undefined
// maybe undefined???
f.apply(null); //$null
f.apply(false); //$boolean false
f.apply(60); //$number 60
f.apply('x'); //$string 'x'

f.call(); //$undefined
f.call(undefined); //$undefined
f.call(null); //$null
f.call(false); //$boolean false
f.call(60); //$number 60
f.call('x'); //$string 'x'
)");

    }
}